

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solve_dense.c
# Opt level: O0

void __thiscall lu_solve_dense(lu *this,double *rhs,double *lhs,char trans)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  char in_CL;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  double dVar23;
  double x;
  lu_int pos;
  lu_int jpivot;
  lu_int ipivot;
  lu_int t;
  lu_int k;
  lu_int i;
  double *work1;
  double *Wvalue;
  lu_int *Windex;
  double *Uvalue;
  lu_int *Uindex;
  double *Lvalue;
  lu_int *Lindex;
  double *row_pivot;
  double *col_pivot;
  lu_int *Wend;
  lu_int *Wbegin;
  lu_int *Rbegin;
  lu_int *Ubegin;
  lu_int *Ltbegin_p;
  lu_int *Lbegin_p;
  lu_int *pivotrow;
  lu_int *pivotcol;
  lu_int *eta_row;
  lu_int *p;
  lu_int nforrest;
  lu_int m;
  double local_e0;
  int local_d8;
  int local_cc;
  int local_c8;
  lu *this_00;
  
  iVar1 = *(int *)(in_RDI + 0x54);
  iVar2 = *(int *)(in_RDI + 0x68);
  lVar22 = *(long *)(in_RDI + 0x250);
  lVar20 = *(long *)(in_RDI + 0x200);
  lVar19 = *(long *)(in_RDI + 0x1d8);
  lVar5 = *(long *)(in_RDI + 0x1e8);
  lVar21 = *(long *)(in_RDI + 0x278);
  lVar18 = *(long *)(in_RDI + 0x240);
  lVar6 = *(long *)(in_RDI + 0x280);
  piVar7 = *(int **)(in_RDI + 0x1f8);
  lVar8 = *(long *)(in_RDI + 0x218);
  lVar9 = *(long *)(in_RDI + 0x228);
  lVar10 = *(long *)(in_RDI + 0x2a8);
  lVar11 = *(long *)(in_RDI + 0x2b0);
  lVar12 = *(long *)(in_RDI + 0x1a0);
  lVar13 = *(long *)(in_RDI + 0x1b8);
  lVar14 = *(long *)(in_RDI + 0x1a8);
  lVar15 = *(long *)(in_RDI + 0x1c0);
  lVar16 = *(long *)(in_RDI + 0x1b0);
  lVar17 = *(long *)(in_RDI + 0x1c8);
  this_00 = *(lu **)(in_RDI + 0x2a0);
  lu_garbage_perm(this_00);
  if ((in_CL == 't') || (in_CL == 'T')) {
    memcpy(this_00,in_RSI,(long)iVar1 << 3);
    for (local_c8 = 0; local_c8 < iVar1; local_c8 = local_c8 + 1) {
      iVar3 = *(int *)(lVar19 + (long)local_c8 * 4);
      iVar4 = *(int *)(lVar5 + (long)local_c8 * 4);
      dVar23 = *(double *)(&this_00->Lmem + (long)iVar3 * 2) / *(double *)(lVar10 + (long)iVar3 * 8)
      ;
      for (local_d8 = *(int *)(lVar8 + (long)iVar3 * 4);
          local_d8 < *(int *)(lVar9 + (long)iVar3 * 4); local_d8 = local_d8 + 1) {
        lVar18 = (long)*(int *)(lVar16 + (long)local_d8 * 4);
        *(double *)(&this_00->Lmem + lVar18 * 2) =
             -dVar23 * *(double *)(lVar17 + (long)local_d8 * 8) +
             *(double *)(&this_00->Lmem + lVar18 * 2);
      }
      *(double *)(in_RDX + (long)iVar4 * 8) = dVar23;
    }
    while (iVar3 = iVar2, local_cc = iVar3 + -1, -1 < local_cc) {
      dVar23 = *(double *)(in_RDX + (long)*(int *)(lVar20 + (long)local_cc * 4) * 8);
      for (local_d8 = piVar7[local_cc]; iVar2 = local_cc, local_d8 < piVar7[iVar3];
          local_d8 = local_d8 + 1) {
        lVar19 = (long)*(int *)(lVar12 + (long)local_d8 * 4);
        *(double *)(in_RDX + lVar19 * 8) =
             -dVar23 * *(double *)(lVar13 + (long)local_d8 * 8) + *(double *)(in_RDX + lVar19 * 8);
      }
    }
    while (local_c8 = iVar1 + -1, -1 < local_c8) {
      local_e0 = 0.0;
      local_d8 = *(int *)(lVar21 + (long)local_c8 * 4);
      while (iVar1 = *(int *)(lVar12 + (long)local_d8 * 4), -1 < iVar1) {
        local_e0 = *(double *)(in_RDX + (long)iVar1 * 8) * *(double *)(lVar13 + (long)local_d8 * 8)
                   + local_e0;
        local_d8 = local_d8 + 1;
      }
      lVar20 = (long)*(int *)(lVar22 + (long)local_c8 * 4);
      *(double *)(in_RDX + lVar20 * 8) = *(double *)(in_RDX + lVar20 * 8) - local_e0;
      iVar1 = local_c8;
    }
  }
  else {
    memcpy(this_00,in_RSI,(long)iVar1 << 3);
    for (local_c8 = 0; local_c8 < iVar1; local_c8 = local_c8 + 1) {
      local_e0 = 0.0;
      local_d8 = *(int *)(lVar18 + (long)local_c8 * 4);
      while (iVar3 = *(int *)(lVar12 + (long)local_d8 * 4), -1 < iVar3) {
        local_e0 = *(double *)(&this_00->Lmem + (long)iVar3 * 2) *
                   *(double *)(lVar13 + (long)local_d8 * 8) + local_e0;
        local_d8 = local_d8 + 1;
      }
      lVar21 = (long)*(int *)(lVar22 + (long)local_c8 * 4);
      *(double *)(&this_00->Lmem + lVar21 * 2) = *(double *)(&this_00->Lmem + lVar21 * 2) - local_e0
      ;
    }
    local_d8 = *piVar7;
    for (local_cc = 0; local_cc < iVar2; local_cc = local_cc + 1) {
      local_e0 = 0.0;
      for (; local_d8 < piVar7[local_cc + 1]; local_d8 = local_d8 + 1) {
        local_e0 = *(double *)(&this_00->Lmem + (long)*(int *)(lVar12 + (long)local_d8 * 4) * 2) *
                   *(double *)(lVar13 + (long)local_d8 * 8) + local_e0;
      }
      lVar22 = (long)*(int *)(lVar20 + (long)local_cc * 4);
      *(double *)(&this_00->Lmem + lVar22 * 2) = *(double *)(&this_00->Lmem + lVar22 * 2) - local_e0
      ;
    }
    while (local_c8 = iVar1 + -1, -1 < local_c8) {
      iVar1 = *(int *)(lVar19 + (long)local_c8 * 4);
      iVar2 = *(int *)(lVar5 + (long)local_c8 * 4);
      dVar23 = *(double *)(&this_00->Lmem + (long)iVar2 * 2) / *(double *)(lVar11 + (long)iVar2 * 8)
      ;
      local_d8 = *(int *)(lVar6 + (long)iVar2 * 4);
      while (iVar2 = *(int *)(lVar14 + (long)local_d8 * 4), -1 < iVar2) {
        *(double *)(&this_00->Lmem + (long)iVar2 * 2) =
             -dVar23 * *(double *)(lVar15 + (long)local_d8 * 8) +
             *(double *)(&this_00->Lmem + (long)iVar2 * 2);
        local_d8 = local_d8 + 1;
      }
      *(double *)(in_RDX + (long)iVar1 * 8) = dVar23;
      iVar1 = local_c8;
    }
  }
  return;
}

Assistant:

void lu_solve_dense(struct lu *this, const double *rhs, double *lhs, char trans)
{
    const lu_int m                  = this->m;
    const lu_int nforrest           = this->nforrest;
    const lu_int *p                 = this->p;
    const lu_int *eta_row           = this->eta_row;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin_p          = this->Lbegin_p;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const lu_int *Rbegin            = this->Rbegin;
    const lu_int *Wbegin            = this->Wbegin;
    const lu_int *Wend              = this->Wend;
    const double *col_pivot         = this->col_pivot;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    const lu_int *Windex            = this->Windex;
    const double *Wvalue            = this->Wvalue;
    double *work1                   = this->work1;

    lu_int i, k, t, ipivot, jpivot, pos;
    double x;

    lu_garbage_perm(this);
    assert(this->pivotlen == m);

    if (trans == 't' || trans == 'T')
    {
        /* ----------------------- */
        /* Solve transposed system */
        /* ----------------------- */

        memcpy(work1, rhs, m*sizeof(double));

        /* Solve with U'. */
        for (k = 0; k < m; k++)
        {
            jpivot = pivotcol[k];
            ipivot = pivotrow[k];
            x = work1[jpivot] / col_pivot[jpivot];
            for (pos = Wbegin[jpivot]; pos < Wend[jpivot]; pos++)
            {
                work1[Windex[pos]] -= x * Wvalue[pos];
            }
            lhs[ipivot] = x;
        }

        /* Solve with update ETAs backwards. */
        for (t = nforrest-1; t >= 0; t--)
        {
            ipivot = eta_row[t];
            x = lhs[ipivot];
            for (pos = Rbegin[t]; pos < Rbegin[t+1]; pos++)
            {
                i = Lindex[pos];
                lhs[i] -= x * Lvalue[pos];
            }
        }

        /* Solve with L'. */
        for (k = m-1; k >= 0; k--)
        {
            x = 0.0;
            for (pos = Lbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
            {
                x += lhs[i] * Lvalue[pos];
            }
            lhs[p[k]] -= x;
        }
    }
    else
    {
        /* -------------------- */
        /* Solve forward system */
        /* -------------------- */

        memcpy(work1, rhs, m*sizeof(double));

        /* Solve with L. */
        for (k = 0; k < m; k++)
        {
            x = 0.0;
            for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
            {
                x += work1[i] * Lvalue[pos];
            }
            work1[p[k]] -= x;
        }

        /* Solve with update ETAs. */
        pos = Rbegin[0];
        for (t = 0; t < nforrest; t++)
        {
            ipivot = eta_row[t];
            x = 0.0;
            for ( ; pos < Rbegin[t+1]; pos++)
            {
                x += work1[Lindex[pos]] * Lvalue[pos];
            }
            work1[ipivot] -= x;
        }

        /* Solve with U. */
        for (k = m-1; k >= 0; k--)
        {
            jpivot = pivotcol[k];
            ipivot = pivotrow[k];
            x = work1[ipivot] / row_pivot[ipivot];
            for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
            {
                work1[i] -= x * Uvalue[pos];
            }
            lhs[jpivot] = x;
        }
    }
}